

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastBrOrCmEqDefinite
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool *pNeedHelper,bool isBranch,
          bool isInHelper)

{
  Lowerer *pLVar1;
  Opnd *pOVar2;
  code *pcVar3;
  Lowerer *compareSrc2;
  bool bVar4;
  uint32 offset;
  LabelInstr *pLVar5;
  Lowerer *this_00;
  BranchInstr *pBVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  RegOpnd *pRVar9;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar10;
  IntConstOpnd *testSrc2;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar11;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  Lowerer *pLVar12;
  LabelInstr *target;
  LabelInstr *branchTarget;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_84;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_82;
  LabelInstr *local_80;
  Lowerer *local_78;
  Lowerer *local_70;
  LabelInstr *local_68;
  undefined4 local_5c;
  LibraryValue local_58;
  LibraryValue local_54;
  Lowerer *local_50;
  LabelInstr *local_48;
  LabelInstr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  local_78 = (Lowerer *)CONCAT44(local_78._4_4_,(int)CONCAT71(in_register_00000089,isInHelper));
  local_5c = (undefined4)CONCAT71(in_register_00000081,isBranch);
  pLVar1 = (Lowerer *)instr->m_src1;
  pLVar12 = (Lowerer *)instr->m_src2;
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  if (!bVar4) {
    local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pLVar12->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsDefinite((ValueType *)&local_34.field_0);
    if (!bVar4) {
      return false;
    }
  }
  local_50 = pLVar12;
  bVar4 = IR::Opnd::IsEqual((Opnd *)pLVar1,(Opnd *)pLVar12);
  if (bVar4) {
    return false;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  local_70 = this;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  if (bVar4) {
    local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(local_50->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsDefinite((ValueType *)&local_34.field_0);
    if (bVar4) {
      bVar4 = IR::Opnd::IsTaggedValue((Opnd *)pLVar1);
      if (bVar4) {
        return true;
      }
      bVar4 = IR::Opnd::IsTaggedValue((Opnd *)local_50);
      if (bVar4) {
        return true;
      }
    }
  }
  local_58 = ValueInvalid;
  pLVar5 = IR::Instr::GetOrCreateContinueLabel(instr,false);
  local_80 = IR::LabelInstr::New(Label,local_70->m_func,local_78._0_1_);
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  pLVar12 = local_50;
  this_00 = local_50;
  if (bVar4) {
    this_00 = pLVar1;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  local_78 = pLVar1;
  if (bVar4) {
    local_78 = pLVar12;
  }
  bVar4 = IR::Instr::IsNeq(instr);
  pLVar12 = local_70;
  local_68 = pLVar5;
  if ((char)local_5c == '\0') {
    local_48 = IR::LabelInstr::New(Label,local_70->m_func,false);
    local_40 = IR::LabelInstr::New(Label,pLVar12->m_func,false);
    local_58 = ValueFalse - bVar4;
    local_54 = bVar4 + ValueTrue;
  }
  else {
    pBVar6 = IR::Instr::AsBranchInstr(instr);
    local_48 = pBVar6->m_branchTarget;
    local_40 = pLVar5;
    if (bVar4) {
      local_48 = pLVar5;
      local_40 = pBVar6->m_branchTarget;
    }
    local_54 = ValueInvalid;
  }
  bVar4 = IR::Opnd::IsRegOpnd((Opnd *)local_78);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5d93,"(likelySrc->IsRegOpnd())","likelySrc->IsRegOpnd()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_00->m_lowererMD).FloatPrefThreshold
  ;
  paVar11 = &local_32;
  bVar4 = ValueType::IsAnyArray((ValueType *)&paVar11->field_0);
  compareSrc2 = local_50;
  pLVar12 = local_70;
  if (!bVar4) {
    local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(this_00->m_lowererMD).FloatPrefThreshold;
    paVar11 = &local_34;
    bVar4 = ValueType::IsSymbol((ValueType *)&paVar11->field_0);
    if (!bVar4) {
      local_84 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(this_00->m_lowererMD).FloatPrefThreshold;
      paVar11 = &local_84;
      bVar4 = ValueType::IsBoolean((ValueType *)&paVar11->field_0);
      if (!bVar4) {
        local_82 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    &(this_00->m_lowererMD).FloatPrefThreshold;
        paVar11 = &local_82;
        bVar4 = ValueType::IsPrimitiveOrObject((ValueType *)&paVar11->field_0);
        if (!bVar4) {
          local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                      &(this_00->m_lowererMD).FloatPrefThreshold;
          paVar11 = &local_32;
          bVar4 = ValueType::IsObject((ValueType *)&paVar11->field_0);
          if ((bVar4) && ((DAT_0143623f & 1) == 0)) {
            InsertCompareBranch((Lowerer *)&paVar11->field_0,(Opnd *)pLVar1,(Opnd *)compareSrc2,
                                BrEq_A,local_48,instr,false);
            pLVar1 = local_78;
            local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(local_78->m_lowererMD).FloatPrefThreshold;
            bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
            if (bVar4) {
              *pNeedHelper = false;
              branchTarget = local_40;
            }
            else {
              pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)pLVar1);
              LowererMD::GenerateObjectTest
                        (&pLVar12->m_lowererMD,&pRVar9->super_Opnd,instr,local_40,false);
              pRVar9 = IR::RegOpnd::New(TyInt64,pLVar12->m_func);
              baseOpnd = IR::Opnd::AsRegOpnd((Opnd *)pLVar1);
              pIVar10 = IR::IndirOpnd::New(baseOpnd,8,TyInt64,pLVar12->m_func,false);
              InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,instr,true);
              offset = Js::Type::GetOffsetOfFlags();
              pIVar10 = IR::IndirOpnd::New(pRVar9,offset,TyInt8,pLVar12->m_func,false);
              branchTarget = local_40;
              testSrc2 = IR::IntConstOpnd::New(8,TyInt8,pLVar12->m_func,false);
              InsertTestBranch(&pIVar10->super_Opnd,&testSrc2->super_Opnd,BrNeq_A,local_80,instr);
            }
            target = local_68;
            pBVar6 = IR::BranchInstr::New(JMP,branchTarget,pLVar12->m_func);
            IR::Instr::InsertBefore(instr,&pBVar6->super_Instr);
            pLVar5 = local_48;
          }
          else {
            bVar4 = IR::Opnd::IsTaggedInt((Opnd *)this_00);
            pLVar5 = local_48;
            if (!bVar4) {
              return true;
            }
            InsertCompareBranch(this_00,(Opnd *)pLVar1,(Opnd *)local_50,BrEq_A,local_48,instr,false)
            ;
            pLVar12 = local_70;
            pBVar6 = IR::BranchInstr::New(JMP,local_80,local_70->m_func);
            IR::Instr::InsertBefore(instr,&pBVar6->super_Instr);
            target = local_68;
            branchTarget = local_40;
          }
          goto LAB_00572021;
        }
      }
    }
  }
  pLVar5 = local_48;
  InsertCompareBranch((Lowerer *)&paVar11->field_0,(Opnd *)pLVar1,(Opnd *)compareSrc2,BrEq_A,
                      local_48,instr,false);
  branchTarget = local_40;
  pBVar6 = IR::BranchInstr::New(JMP,local_40,pLVar12->m_func);
  IR::Instr::InsertBefore(instr,&pBVar6->super_Instr);
  *pNeedHelper = false;
  target = local_68;
LAB_00572021:
  if ((char)local_5c == '\0') {
    IR::Instr::InsertBefore(instr,&pLVar5->super_Instr);
    pOVar2 = instr->m_dst;
    pOVar8 = LoadLibraryValueOpnd(pLVar12,instr,local_54);
    InsertMove(pOVar2,pOVar8,instr,true);
    InsertBranch(Br,target,instr);
    IR::Instr::InsertBefore(instr,&branchTarget->super_Instr);
    pOVar2 = instr->m_dst;
    pOVar8 = LoadLibraryValueOpnd(pLVar12,instr,local_58);
    InsertMove(pOVar2,pOVar8,instr,true);
    InsertBranch(Br,target,instr);
  }
  IR::Instr::InsertBefore(instr,&local_80->super_Instr);
  return true;
}

Assistant:

bool Lowerer::GenerateFastBrOrCmEqDefinite(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool *pNeedHelper, bool isBranch, bool isInHelper)
{
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (!src1->GetValueType().IsDefinite() && !src2->GetValueType().IsDefinite())
    {
        return false;
    }
    if (src1->IsEqual(src2))
    {
        return false;
    }
    if (src1->GetValueType().IsDefinite() && src2->GetValueType().IsDefinite())
    {
        if (src1->IsTaggedValue() || src2->IsTaggedValue())
        {
            return true;
        }
    }

    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    IR::LabelInstr * labelFallThrough = instr->GetOrCreateContinueLabel();
    IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    IR::Opnd * definiteSrc = src1->GetValueType().IsDefinite() ? src1 : src2;
    IR::Opnd * likelySrc = src1->GetValueType().IsDefinite() ? src2 : src1;

    bool isEqual = !instr->IsNeq();

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    }
    else
    {
        labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
        labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
    }

    Assert(likelySrc->IsRegOpnd());

    if (definiteSrc->GetValueType().IsAnyArray() || definiteSrc->GetValueType().IsSymbol() || definiteSrc->GetValueType().IsBoolean() || definiteSrc->GetValueType().IsPrimitiveOrObject())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
        *pNeedHelper = false;
    }
    else if (definiteSrc->GetValueType().IsObject() && !CONFIG_FLAG(ESBigInt))
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

        if (!likelySrc->GetValueType().IsDefinite())
        {
            m_lowererMD.GenerateObjectTest(likelySrc->AsRegOpnd(), instr, labelBranchFailure);
            IR::RegOpnd * likelyTypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            IR::IndirOpnd * likelyType = IR::IndirOpnd::New(likelySrc->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
            Lowerer::InsertMove(likelyTypeReg, likelyType, instr);
            IR::Opnd *likelyFlags = IR::IndirOpnd::New(likelyTypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(likelyFlags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
        }
        else
        {
            *pNeedHelper = false;
        }

        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
    }
    else if (definiteSrc->IsTaggedInt())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
        instr->InsertBefore(branch);
    }
    else
    {
        return true;
    }

    if (!isBranch)
    {
        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

        instr->InsertBefore(labelBranchFailure);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
    }

    instr->InsertBefore(labelHelper);

    return true;
}